

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::setType(SPxSteepPR<double> *this,Type type)

{
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(this->super_SPxPricer<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->workRhs)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  setupWeights(this,type);
  SSVectorBase<double>::clear(&this->workVec);
  SSVectorBase<double>::clear(&this->workRhs);
  this->refined = false;
  (this->bestPrices).super_IdxSet.num = 0;
  DIdxSet::setMax(&this->bestPrices,
                  (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  Array<soplex::SPxPricer<double>::IdxElement>::reSize
            (&this->prices,(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  if (type == ENTER) {
    (this->bestPricesCo).super_IdxSet.num = 0;
    DIdxSet::setMax(&this->bestPricesCo,
                    (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum);
    Array<soplex::SPxPricer<double>::IdxElement>::reSize
              (&this->pricesCo,(((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum
              );
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setType(typename SPxSolverBase<R>::Type type)
{
   workRhs.setTolerances(this->_tolerances);

   setupWeights(type);
   workVec.clear();
   workRhs.clear();
   refined = false;

   bestPrices.clear();
   bestPrices.setMax(this->thesolver->dim());
   prices.reSize(this->thesolver->dim());

   if(type == SPxSolverBase<R>::ENTER)
   {
      bestPricesCo.clear();
      bestPricesCo.setMax(this->thesolver->coDim());
      pricesCo.reSize(this->thesolver->coDim());
   }
}